

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O2

QDataStream * QtPrivate::readArrayBasedContainer<QList<Qt::Key>>(QDataStream *s,QList<Qt::Key> *c)

{
  qint64 asize;
  long in_FS_OFFSET;
  bool bVar1;
  value_type t;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver((StreamStateSaver *)local_38,s);
  QList<Qt::Key>::clear(c);
  asize = QDataStream::readQSizeType(s);
  if (asize < 0) {
    QDataStream::setStatus((Status)s);
  }
  else {
    QList<Qt::Key>::reserve(c,asize);
    while (bVar1 = asize != 0, asize = asize + -1, bVar1) {
      t = 0xaaaaaaaa;
      ::operator>>(s,&t);
      if (s[0x13] != (QDataStream)0x0) {
        QList<Qt::Key>::clear(c);
        break;
      }
      QList<Qt::Key>::append(c,t);
    }
  }
  StreamStateSaver::~StreamStateSaver((StreamStateSaver *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}